

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFV.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::HFV::get_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,HFV *this,
          size_t address)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  stat *psVar3;
  _Base_ptr __nbytes;
  _Base_ptr p_Var4;
  long source_address;
  FileHolder *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  FILE *local_48;
  pointer local_38;
  
  p_Var1 = &(this->writes_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->writes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __nbytes = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < address]) {
    if (*(ulong *)(p_Var4 + 1) >= address) {
      __nbytes = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)__nbytes != p_Var1) &&
     (p_Var4 = __nbytes, address < *(ulong *)(__nbytes + 1))) {
    __nbytes = &p_Var1->_M_header;
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[1]._M_parent);
    return __return_storage_ptr__;
  }
  sVar2 = Encodings::Macintosh::VolumeProvider::driver_size
                    ((VolumeProvider *)&(this->mapper_).field_0x10);
  source_address = (address - (sVar2 + 0x1ff >> 9)) + -0x40;
  if (-1 < source_address) {
    this_00 = &this->file_;
    psVar3 = FileHolder::stats(this_00);
    if ((ulong)(source_address * 0x200) < (ulong)psVar3->st_size) {
      FileHolder::seek(this_00,source_address * 0x200,0);
      FileHolder::read((FileHolder *)&stack0xffffffffffffffb8,(int)this_00,(void *)0x200,
                       (size_t)__nbytes);
      Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
      convert_source_block
                (__return_storage_ptr__,&this->mapper_,source_address,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffb8);
      goto joined_r0x0044d5d5;
    }
  }
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
  convert_source_block(__return_storage_ptr__,&this->mapper_,source_address,&local_68);
  local_48 = (FILE *)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  local_38 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
joined_r0x0044d5d5:
  if (local_48 != (FILE *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> HFV::get_block(size_t address) {
	const auto written = writes_.find(address);
	if(written != writes_.end()) return written->second;

	const auto source_address = mapper_.to_source_address(address);
	if(source_address >= 0 && size_t(source_address)*get_block_size() < size_t(file_.stats().st_size)) {
		const long file_offset = long(get_block_size()) * long(source_address);
		file_.seek(file_offset, SEEK_SET);
		return mapper_.convert_source_block(source_address, file_.read(get_block_size()));
	} else {
		return mapper_.convert_source_block(source_address);
	}
}